

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

ElementTypeAndOffset * __thiscall
choc::value::Type::ComplexArray::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,ComplexArray *this,uint32_t index)

{
  Content *pCVar1;
  MainType MVar2;
  int iVar3;
  uint uVar4;
  RepeatedGroup *pRVar5;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  Object *this_00;
  long lVar9;
  long lVar10;
  size_t sVar11;
  
  uVar7 = (ulong)(this->groups).size;
  if (uVar7 != 0) {
    pRVar5 = (this->groups).items;
    lVar9 = 0;
    lVar10 = 0;
    do {
      MVar2 = (&(pRVar5->elementType).mainType)[lVar9];
      sVar11 = 4;
      if (MVar2 < string) {
        switch(MVar2) {
        case void_:
          sVar11 = 0;
          break;
        case boolean:
          sVar11 = 1;
          break;
        case ~(complexArray|primitiveArray|vector|int64|int32|boolean):
        case ~(complexArray|primitiveArray|vector|int64|int32):
        case int32|boolean:
        case ~(complexArray|primitiveArray|vector|int64|boolean):
        case ~(complexArray|primitiveArray|vector|int64):
switchD_001c7122_caseD_2:
          throwError("Invalid type");
        case int32:
          break;
        case int64:
switchD_001c7122_caseD_8:
          sVar11 = 8;
          break;
        default:
          if (MVar2 != float32) {
            if (MVar2 != float64) goto switchD_001c7122_caseD_2;
            goto switchD_001c7122_caseD_8;
          }
        }
      }
      else if (MVar2 < primitiveArray) {
        if (MVar2 != string) {
          if (MVar2 != vector) goto switchD_001c7122_caseD_2;
          sVar11 = (ulong)*(uint *)((long)&(pRVar5->elementType).content + lVar9 + 4) *
                   (ulong)((byte)(pRVar5->elementType).content.field4[lVar9] & 0xf);
        }
      }
      else if (MVar2 == primitiveArray) {
        iVar3 = *(int *)((long)&(pRVar5->elementType).content + lVar9 + 8);
        sVar11 = (ulong)*(uint *)((long)&(pRVar5->elementType).content + lVar9 + 4) *
                 (ulong)((iVar3 + (uint)(iVar3 == 0)) *
                        ((byte)(pRVar5->elementType).content.field4[lVar9] & 0xf));
      }
      else if (MVar2 == complexArray) {
        sVar11 = getValueDataSize(*(ComplexArray **)((long)&(pRVar5->elementType).content + lVar9));
      }
      else {
        if (MVar2 != object) goto switchD_001c7122_caseD_2;
        sVar11 = Object::getValueDataSize
                           (*(Object **)((long)&(pRVar5->elementType).content + lVar9));
      }
      uVar4 = *(uint *)((long)&pRVar5->repetitions + lVar9);
      if (index < uVar4) {
        puVar8 = (undefined8 *)((long)&(pRVar5->elementType).content + lVar9);
        MVar2 = (&(pRVar5->elementType).mainType)[lVar9];
        pCVar1 = &(__return_storage_ptr__->elementType).content;
        (__return_storage_ptr__->elementType).mainType = MVar2;
        (__return_storage_ptr__->elementType).allocator = (Allocator *)0x0;
        if (MVar2 == object) {
          other_00 = (Object *)*puVar8;
          this_00 = (Object *)malloc(0x28);
          Object::Object(this_00,(Allocator *)0x0,other_00);
        }
        else {
          if (MVar2 != complexArray) {
            uVar6 = *(undefined8 *)((long)&(pRVar5->elementType).content + lVar9 + 8);
            pCVar1->object = (Object *)*puVar8;
            *(undefined8 *)((long)&(__return_storage_ptr__->elementType).content + 8) = uVar6;
            goto LAB_001c7269;
          }
          other = (ComplexArray *)*puVar8;
          this_00 = (Object *)malloc(0x18);
          ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
        }
        pCVar1->complexArray = (ComplexArray *)this_00;
LAB_001c7269:
        __return_storage_ptr__->offset = sVar11 * index + lVar10;
        return __return_storage_ptr__;
      }
      index = index - uVar4;
      lVar10 = lVar10 + sVar11 * uVar4;
      lVar9 = lVar9 + 0x28;
    } while (uVar7 * 0x28 != lVar9);
  }
  throwError("Index out of range");
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (auto& g : groups)
        {
            auto elementSize = g.elementType.getValueDataSize();

            if (index < g.repetitions)
                return { g.elementType, offset + elementSize * index };

            index -= g.repetitions;
            offset += elementSize * g.repetitions;
        }

        throwError ("Index out of range");
    }